

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool anon_unknown.dwarf_136e9d::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  CompareOp CVar8;
  char *pcVar9;
  char *__s1;
  char *pcVar10;
  char *pcVar11;
  
  CVar8 = OP_EQUAL;
  while( true ) {
    if ((9 < (byte)(*lhss - 0x30U)) && (9 < (byte)(*rhss - 0x30U))) goto LAB_001a103e;
    pcVar9 = lhss + -1;
    __s1 = pcVar9;
    do {
      pcVar9 = pcVar9 + 1;
      pcVar6 = __s1 + 1;
      __s1 = __s1 + 1;
    } while (*pcVar6 == '0');
    pcVar6 = rhss + -1;
    do {
      pcVar11 = pcVar6;
      pcVar6 = pcVar11 + 1;
      lVar3 = -1;
      pcVar4 = __s1;
    } while (pcVar11[1] == '0');
    do {
      pcVar10 = pcVar4;
      lVar7 = lVar3;
      cVar1 = *pcVar10;
      lVar3 = lVar7 + -1;
      pcVar4 = pcVar10 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    do {
      cVar2 = pcVar11[1];
      pcVar11 = pcVar11 + 1;
      lVar7 = lVar7 + 1;
    } while ((byte)(cVar2 - 0x30U) < 10);
    if (lVar7 == 0) {
      iVar5 = strncmp(__s1,pcVar6,(long)pcVar10 - (long)pcVar9);
      lVar7 = (long)iVar5;
    }
    else {
      lVar7 = -lVar7;
    }
    if (lVar7 < 0) break;
    if (lVar7 != 0) {
      CVar8 = OP_GREATER;
LAB_001a103e:
      return (op & CVar8) != 0;
    }
    rhss = pcVar11 + (cVar2 == '.');
    lhss = pcVar10 + (cVar1 == '.');
  }
  CVar8 = OP_LESS;
  goto LAB_001a103e;
}

Assistant:

bool VersionCompare(cmSystemTools::CompareOp op, const char* lhss,
                    const char* rhss)
{
  const char* endl = lhss;
  const char* endr = rhss;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9'))) {
    // Do component-wise comparison, ignoring leading zeros
    // (components are treated as integers, not as mantissas)
    while (*endl == '0') {
      endl++;
    }
    while (*endr == '0') {
      endr++;
    }

    const char* beginl = endl;
    const char* beginr = endr;

    // count significant digits
    while ((*endl >= '0') && (*endl <= '9')) {
      endl++;
    }
    while ((*endr >= '0') && (*endr <= '9')) {
      endr++;
    }

    // compare number of digits first
    ptrdiff_t r = ((endl - beginl) - (endr - beginr));
    if (r == 0) {
      // compare the digits if number of digits is equal
      r = strncmp(beginl, beginr, endl - beginl);
    }

    if (r < 0) {
      // lhs < rhs, so true if operation is LESS
      return (op & cmSystemTools::OP_LESS) != 0;
    }
    if (r > 0) {
      // lhs > rhs, so true if operation is GREATER
      return (op & cmSystemTools::OP_GREATER) != 0;
    }

    if (*endr == '.') {
      endr++;
    }

    if (*endl == '.') {
      endl++;
    }
  }
  // lhs == rhs, so true if operation is EQUAL
  return (op & cmSystemTools::OP_EQUAL) != 0;
}